

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrandomopentest.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  long lVar2;
  size_t __size;
  char *__ptr;
  zip_uint8_t buf [1024];
  char local_408 [1032];
  
  cVar1 = zip_secure_random(local_408,0x400);
  if (cVar1 == '\0') {
    __ptr = "zip_secure_random returned false\n";
    __size = 0x21;
  }
  else {
    lVar2 = 0;
    while (local_408[lVar2] == '\0') {
      lVar2 = lVar2 + 1;
      if (lVar2 == 0x400) {
        exit(0);
      }
    }
    __ptr = "non-zero byte found\n";
    __size = 0x14;
  }
  fwrite(__ptr,__size,1,_stderr);
  exit(1);
}

Assistant:

int
main(int argc, const char *argv[]) {
    zip_uint8_t buf[1024];
    int i;

#ifdef HAVE_CRYPTO
    if (!zip_secure_random(buf, sizeof(buf))) {
	fprintf(stderr, "zip_secure_random returned false\n");
	exit(1);
    }
    for (i = 0; i < sizeof(buf); i++) {
	if (buf[i] != 0) {
	    fprintf(stderr, "non-zero byte found\n");
	    exit(1);
	}
    }
#endif
    exit(0);
}